

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPart.c
# Opt level: O1

void Aig_ManSupportsTest(Aig_Man_t *pMan)

{
  int iVar1;
  void **ppvVar2;
  void *__ptr;
  Vec_Ptr_t *__ptr_00;
  long lVar3;
  
  __ptr_00 = Aig_ManSupports(pMan);
  iVar1 = __ptr_00->nSize;
  if (0 < (long)iVar1) {
    ppvVar2 = __ptr_00->pArray;
    lVar3 = 0;
    do {
      __ptr = ppvVar2[lVar3];
      if (__ptr != (void *)0x0) {
        if (*(void **)((long)__ptr + 8) != (void *)0x0) {
          free(*(void **)((long)__ptr + 8));
          *(undefined8 *)((long)__ptr + 8) = 0;
        }
        free(__ptr);
      }
      lVar3 = lVar3 + 1;
    } while (iVar1 != lVar3);
  }
  if (__ptr_00->pArray != (void **)0x0) {
    free(__ptr_00->pArray);
    __ptr_00->pArray = (void **)0x0;
  }
  if (__ptr_00 != (Vec_Ptr_t *)0x0) {
    free(__ptr_00);
    return;
  }
  return;
}

Assistant:

void Aig_ManSupportsTest( Aig_Man_t * pMan )
{
    Vec_Ptr_t * vSupps;
    vSupps = Aig_ManSupports( pMan );
    Vec_VecFree( (Vec_Vec_t *)vSupps );
}